

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav__metadata_process_info_text_chunk
                    (ma_dr_wav__metadata_parser *pParser,ma_uint64 chunkSize,
                    ma_dr_wav_metadata_type type)

{
  int iVar1;
  ma_uint8 *pmVar2;
  ma_dr_wav_metadata_type in_EDX;
  ulong in_RSI;
  ma_dr_wav__metadata_parser *in_RDI;
  ma_dr_wav_metadata *pMetadata;
  ma_uint32 stringSizeWithNullTerminator;
  ma_uint64 bytesRead;
  size_t in_stack_ffffffffffffffc8;
  ma_dr_wav_metadata *pBufferOut;
  undefined4 in_stack_ffffffffffffffd8;
  size_t local_20;
  
  local_20 = 0;
  iVar1 = (int)in_RSI;
  if (in_RDI->stage == ma_dr_wav__metadata_parser_stage_count) {
    in_RDI->metadataCount = in_RDI->metadataCount + 1;
    ma_dr_wav__metadata_request_extra_memory_for_stage_2(in_RDI,in_RSI & 0xffffffff,1);
  }
  else {
    pBufferOut = in_RDI->pMetadata + in_RDI->metadataCursor;
    pBufferOut->type = in_EDX;
    if (iVar1 == 0) {
      (pBufferOut->data).cue.cuePointCount = 0;
      (pBufferOut->data).cue.pCuePoints = (ma_dr_wav_cue_point *)0x0;
      in_RDI->metadataCursor = in_RDI->metadataCursor + 1;
    }
    else {
      (pBufferOut->data).cue.cuePointCount = iVar1 - 1;
      pmVar2 = ma_dr_wav__metadata_get_memory(in_RDI,in_RSI & 0xffffffff,1);
      (pBufferOut->data).bext.pOriginatorName = (char *)pmVar2;
      local_20 = ma_dr_wav__metadata_parser_read
                           ((ma_dr_wav__metadata_parser *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                            pBufferOut,in_stack_ffffffffffffffc8,(ma_uint64 *)0x217df1);
      if (local_20 == in_RSI) {
        in_RDI->metadataCursor = in_RDI->metadataCursor + 1;
      }
    }
  }
  return local_20;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__metadata_process_info_text_chunk(ma_dr_wav__metadata_parser* pParser, ma_uint64 chunkSize, ma_dr_wav_metadata_type type)
{
    ma_uint64 bytesRead = 0;
    ma_uint32 stringSizeWithNullTerminator = (ma_uint32)chunkSize;
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
        pParser->metadataCount += 1;
        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, stringSizeWithNullTerminator, 1);
    } else {
        ma_dr_wav_metadata* pMetadata = &pParser->pMetadata[pParser->metadataCursor];
        pMetadata->type = type;
        if (stringSizeWithNullTerminator > 0) {
            pMetadata->data.infoText.stringLength = stringSizeWithNullTerminator - 1;
            pMetadata->data.infoText.pString = (char*)ma_dr_wav__metadata_get_memory(pParser, stringSizeWithNullTerminator, 1);
            MA_DR_WAV_ASSERT(pMetadata->data.infoText.pString != NULL);
            bytesRead = ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.infoText.pString, (size_t)stringSizeWithNullTerminator, NULL);
            if (bytesRead == chunkSize) {
                pParser->metadataCursor += 1;
            } else {
            }
        } else {
            pMetadata->data.infoText.stringLength = 0;
            pMetadata->data.infoText.pString      = NULL;
            pParser->metadataCursor += 1;
        }
    }
    return bytesRead;
}